

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_NtkSetRefs(Wlc_Ntk_t *p)

{
  Wlc_Obj_t *pWVar1;
  int *piVar2;
  uint uVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar8;
  ulong uVar9;
  
  uVar3 = p->iObj;
  if ((p->vRefs).nCap < (int)uVar3) {
    piVar4 = (p->vRefs).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar3 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar3 << 2);
    }
    (p->vRefs).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vRefs).nCap = uVar3;
  }
  if (0 < (int)uVar3) {
    memset((p->vRefs).pArray,0,(ulong)uVar3 * 4);
  }
  (p->vRefs).nSize = uVar3;
  iVar6 = p->iObj;
  if (1 < iVar6) {
    lVar5 = 1;
    do {
      if (p->nObjsAlloc <= lVar5) goto LAB_00370d86;
      uVar3 = p->pObjs[lVar5].nFanins;
      uVar9 = (ulong)uVar3;
      if (0 < (int)uVar3) {
        pWVar1 = p->pObjs + lVar5;
        lVar7 = 0;
        do {
          if ((2 < (uint)uVar9) ||
             (paVar8 = &pWVar1->field_10, (*(uint *)pWVar1 & 0x3f | 0x10) == 0x16)) {
            paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
          }
          iVar6 = paVar8->Fanins[lVar7];
          if (((long)iVar6 < 0) || ((p->vRefs).nSize <= iVar6)) goto LAB_00370d67;
          piVar4 = (p->vRefs).pArray + iVar6;
          *piVar4 = *piVar4 + 1;
          lVar7 = lVar7 + 1;
          uVar9 = (ulong)(int)pWVar1->nFanins;
        } while (lVar7 < (long)uVar9);
        iVar6 = p->iObj;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar6);
  }
  if (0 < (p->vCos).nSize) {
    piVar4 = (p->vCos).pArray;
    lVar5 = 0;
    do {
      iVar6 = piVar4[lVar5];
      if (((long)iVar6 < 1) || (p->nObjsAlloc <= iVar6)) {
LAB_00370d86:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((p->vRefs).nSize <= iVar6) {
LAB_00370d67:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar2 = (p->vRefs).pArray + iVar6;
      *piVar2 = *piVar2 + 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (p->vCos).nSize);
  }
  return;
}

Assistant:

void Wlc_NtkSetRefs( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; int i, k, Fanin;
    Vec_IntFill( &p->vRefs, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObj( p, pObj, i )
        Wlc_ObjForEachFanin( pObj, Fanin, k )
            Vec_IntAddToEntry( &p->vRefs, Fanin, 1 );
    Wlc_NtkForEachCo( p, pObj, i )
        Vec_IntAddToEntry( &p->vRefs, Wlc_ObjId(p, pObj), 1 );
}